

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

void google::protobuf::internal::WireFormat::SerializeWithCachedSizes
               (Message *message,int size,CodedOutputStream *output)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  UnknownFieldSet *pUVar4;
  LogMessage *pLVar5;
  int i_1;
  long lVar6;
  ulong uVar7;
  int i;
  long lVar8;
  LogFinisher local_8d;
  int local_8c;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  LogMessage local_68;
  long lVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar1);
  local_8c = (size + output->total_bytes_) - output->buffer_size_;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(char *)(*(long *)(lVar2 + 0x20) + 0x6b) == '\x01') {
    lVar6 = 0;
    for (lVar8 = 0; lVar8 < *(int *)(lVar2 + 0x2c); lVar8 = lVar8 + 1) {
      local_68._0_8_ = *(long *)(lVar2 + 0x30) + lVar6;
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&fields,(FieldDescriptor **)&local_68);
      lVar6 = lVar6 + 0xa8;
    }
  }
  else {
    (**(code **)(*plVar3 + 0x80))(plVar3,message,&fields);
  }
  for (uVar7 = 0;
      uVar7 < (ulong)((long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    SerializeFieldWithCachedSizes
              (fields.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7],message,output);
  }
  if (*(char *)(*(long *)(lVar2 + 0x20) + 0x68) == '\0') {
    pUVar4 = (UnknownFieldSet *)(**(code **)(*plVar3 + 0x10))(plVar3,message);
    SerializeUnknownFields(pUVar4,output);
  }
  else {
    pUVar4 = (UnknownFieldSet *)(**(code **)(*plVar3 + 0x10))(plVar3,message);
    SerializeUnknownMessageSetItems(pUVar4,output);
  }
  if (output->total_bytes_ - output->buffer_size_ != local_8c) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x33e);
    pLVar5 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (output->ByteCount()) == (expected_endpoint): ");
    pLVar5 = LogMessage::operator<<
                       (pLVar5,
                        ": Protocol message serialized to a size different from what was originally expected.  Perhaps it was modified by another thread during serialization?"
                       );
    LogFinisher::operator=(&local_8d,pLVar5);
    LogMessage::~LogMessage(&local_68);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return;
}

Assistant:

void WireFormat::SerializeWithCachedSizes(
    const Message& message,
    int size, io::CodedOutputStream* output) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();
  int expected_endpoint = output->ByteCount() + size;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (int i = 0; i < fields.size(); i++) {
    SerializeFieldWithCachedSizes(fields[i], message, output);
  }

  if (descriptor->options().message_set_wire_format()) {
    SerializeUnknownMessageSetItems(
        message_reflection->GetUnknownFields(message), output);
  } else {
    SerializeUnknownFields(
        message_reflection->GetUnknownFields(message), output);
  }

  GOOGLE_CHECK_EQ(output->ByteCount(), expected_endpoint)
    << ": Protocol message serialized to a size different from what was "
       "originally expected.  Perhaps it was modified by another thread "
       "during serialization?";
}